

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

void __thiscall wirehair::Codec::FreeMatrix(Codec *this)

{
  if (this->_compress_matrix != (uint64_t *)0x0) {
    SIMDSafeFree(this->_compress_matrix);
    this->_compress_matrix = (uint64_t *)0x0;
  }
  this->_ge_allocated = 0;
  return;
}

Assistant:

void Codec::FreeMatrix()
{
    // If memory was allocated:
    if (_compress_matrix != nullptr)
    {
        // Free it now
        SIMDSafeFree(_compress_matrix);
        _compress_matrix = nullptr;
    }

    _ge_allocated = 0;
}